

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var __thiscall
Js::JavascriptNativeArray::FindMinOrMax<int,false>
          (JavascriptNativeArray *this,ScriptContext *scriptContext,bool findMax)

{
  uint uVar1;
  Type TVar2;
  SparseArraySegmentBase *pSVar3;
  code *pcVar4;
  bool bVar5;
  DynamicObjectFlags DVar6;
  Type TVar7;
  undefined4 *puVar8;
  Var pvVar9;
  ulong uVar10;
  
  DVar6 = DynamicObject::GetArrayFlags((DynamicObject *)this);
  if ((DVar6 & HasNoMissingValues) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa10,"(this->HasNoMissingValues())",
                                "Fastpath is only for arrays with one segment and no missing values"
                               );
    if (!bVar5) goto LAB_00b970a5;
    *puVar8 = 0;
  }
  pSVar3 = (this->super_JavascriptArray).head.ptr;
  uVar1 = pSVar3->length;
  if (uVar1 != (this->super_JavascriptArray).super_ArrayObject.length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0xa15,"(headSegLen == len)","headSegLen == len");
    if (!bVar5) goto LAB_00b970a5;
    *puVar8 = 0;
  }
  if ((pSVar3->next).ptr == (SparseArraySegmentBase *)0x0) {
    TVar7 = pSVar3[1].left;
    if ((ulong)uVar1 != 0) {
      uVar10 = 0;
      do {
        TVar2 = (&pSVar3[1].left)[uVar10];
        if (findMax) {
          if ((int)TVar7 < (int)TVar2) {
LAB_00b97024:
            TVar7 = TVar2;
          }
        }
        else if ((int)TVar2 < (int)TVar7) goto LAB_00b97024;
        uVar10 = uVar10 + 1;
      } while (uVar1 != uVar10);
    }
    pvVar9 = JavascriptNumber::ToVarNoCheck((double)(int)TVar7,scriptContext);
    return pvVar9;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar8 = 1;
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                              ,0xa2b,"(false)",
                              "FindMinOrMax currently supports native arrays with only one segment")
  ;
  if (bVar5) {
    *puVar8 = 0;
    Throw::FatalInternalError(-0x7fffbffb);
  }
LAB_00b970a5:
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

Var JavascriptNativeArray::FindMinOrMax(Js::ScriptContext * scriptContext, bool findMax)
    {
        AssertMsg(this->HasNoMissingValues(), "Fastpath is only for arrays with one segment and no missing values");
        uint len = this->GetLength();

        Js::SparseArraySegment<T>* headSegment = ((Js::SparseArraySegment<T>*)this->GetHead());
        uint headSegLen = headSegment->length;
        Assert(headSegLen == len);

        if (headSegment->next == nullptr)
        {
            T currentRes = headSegment->elements[0];
            for (uint i = 0; i < headSegLen; i++)
            {
                T compare = headSegment->elements[i];
                if (checkNaNAndNegZero && JavascriptNumber::IsNan(double(compare)))
                {
                    return scriptContext->GetLibrary()->GetNaN();
                }
                if (findMax ? currentRes < compare : currentRes > compare ||
                    (checkNaNAndNegZero && compare == 0 && Js::JavascriptNumber::IsNegZero(double(currentRes))))
                {
                    currentRes = compare;
                }
            }
            return Js::JavascriptNumber::ToVarNoCheck(currentRes, scriptContext);
        }
        else
        {
            AssertMsg(false, "FindMinOrMax currently supports native arrays with only one segment");
            Throw::FatalInternalError();
        }
    }